

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

void sat_solver3_set_var_activity(sat_solver3 *s,int *pVars,int nVars)

{
  int iVar1;
  word *pwVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  if (s->VarActType != 1) {
    __assert_fail("s->VarActType == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                  ,0xdb,"void sat_solver3_set_var_activity(sat_solver3 *, int *, int)");
  }
  if (0 < (long)s->size) {
    memset(s->activity,0,(long)s->size << 3);
  }
  s->var_inc = 0x3ff0000000000000;
  if (0 < nVars) {
    pwVar2 = s->activity;
    piVar3 = s->orderpos;
    piVar4 = (s->order).ptr;
    uVar7 = 0;
    do {
      iVar8 = (int)uVar7;
      if (pVars != (int *)0x0) {
        iVar8 = pVars[uVar7];
      }
      pwVar2[iVar8] = (word)(double)(nVars - (int)uVar7);
      uVar11 = piVar3[iVar8];
      uVar9 = (ulong)(int)uVar11;
      iVar8 = piVar4[uVar9];
      if (uVar9 != 0) {
        if (uVar11 == 0xffffffff) {
          __assert_fail("s->orderpos[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                        ,0x91,"void order_update(sat_solver3 *, int)");
        }
        uVar5 = pwVar2[iVar8];
        do {
          uVar6 = (uint)uVar9;
          uVar10 = (int)((uVar6 - ((int)(uVar6 - 1) >> 0x1f)) + -1) >> 1;
          iVar1 = piVar4[(int)uVar10];
          uVar11 = uVar6;
          if (uVar5 <= pwVar2[iVar1]) break;
          piVar4[(int)uVar6] = iVar1;
          piVar3[iVar1] = uVar6;
          uVar9 = (ulong)uVar10;
          uVar11 = uVar10;
        } while (2 < uVar6);
      }
      piVar4[(int)uVar11] = iVar8;
      piVar3[iVar8] = uVar11;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nVars);
  }
  return;
}

Assistant:

void sat_solver3_set_var_activity(sat_solver3* s, int * pVars, int nVars) 
{
    int i;
    assert( s->VarActType == 1 );
    for (i = 0; i < s->size; i++)
        s->activity[i] = 0;
    s->var_inc = Abc_Dbl2Word(1);
    for ( i = 0; i < nVars; i++ )
    {
        int iVar = pVars ? pVars[i] : i;
        s->activity[iVar] = Abc_Dbl2Word(nVars-i);
        order_update( s, iVar );
    }
}